

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page.cpp
# Opt level: O0

vector<record,_std::allocator<record>_> * __thiscall
page::getRecords(vector<record,_std::allocator<record>_> *__return_storage_ptr__,page *this,
                fstream *stream,int offset,uint8_t numFields)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  reference this_00;
  undefined1 local_58 [8];
  record record;
  int local_38;
  int i;
  int k;
  allocator<record> local_27;
  undefined1 local_26;
  uint8_t local_25;
  int local_24;
  uint8_t numFields_local;
  fstream *pfStack_20;
  int offset_local;
  fstream *stream_local;
  page *this_local;
  vector<record,_std::allocator<record>_> *records;
  
  local_26 = 0;
  bVar1 = this->numRecords;
  local_25 = numFields;
  local_24 = offset;
  pfStack_20 = stream;
  stream_local = (fstream *)this;
  this_local = (page *)__return_storage_ptr__;
  std::allocator<record>::allocator(&local_27);
  std::vector<record,_std::allocator<record>_>::vector
            (__return_storage_ptr__,(ulong)bVar1,&local_27);
  std::allocator<record>::~allocator(&local_27);
  local_38 = 0;
  record._20_4_ = 0;
  while( true ) {
    bVar2 = false;
    if ((int)record._20_4_ < (int)(uint)this->slotSize) {
      bVar2 = local_38 < (int)(uint)this->numRecords;
    }
    if (!bVar2) break;
    if (this->slots[(int)record._20_4_] != '\0') {
      ::record::record((record *)local_58,'\0',local_25);
      uVar3 = local_24 + (uint)this->slotSize;
      ::record::read((record *)local_58,(int)pfStack_20,
                     (void *)(ulong)((this->slots[(int)record._20_4_] - 1) * this->recordSize + 2 +
                                    uVar3),(ulong)uVar3);
      this_00 = std::vector<record,_std::allocator<record>_>::operator[]
                          (__return_storage_ptr__,(long)local_38);
      ::record::operator=(this_00,(record *)local_58);
      local_38 = local_38 + 1;
      ::record::~record((record *)local_58);
    }
    record._20_4_ = record._20_4_ + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<record> page::getRecords(std::fstream &stream, int offset, uint8_t numFields) {

    auto records = std::vector<record>(this->numRecords);
    int k = 0;
    for (int i = 0; i < this->slotSize && k < this->numRecords; ++i) {
        if(this->slots[i] == 0) { continue; }
        record record(0, numFields);
        record.read(stream, offset + PAGE_ID + PAGE_NUM_RECORDS + this->slotSize + (this->slots[i] - 1) * this->recordSize);
        records[k] = record;
        k++;
    }

    return records;
}